

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonschema_draft201909_tests.cpp
# Opt level: O2

void anon_unknown.dwarf_3128586::jsonschema_tests(string *fpath,evaluation_options *options)

{
  bool bVar1;
  ostream *poVar2;
  iterator this;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *extraout_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *extraout_RDX_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *extraout_RDX_01;
  iterator iVar6;
  iterator this_00;
  array_range_type aVar7;
  const_array_range_type cVar8;
  int count;
  int count_test;
  string *local_4f8;
  long *local_4f0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_4e8;
  size_t errors;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> context;
  iterator local_498;
  json tests;
  StringRef local_468;
  string_view_type local_458;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_448;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> patch;
  json_pointer instance_location;
  error_reporter_adaptor adaptor;
  AssertionHandler catchAssertionHandler;
  evaluation_options local_290;
  fstream is;
  byte abStack_220 [496];
  iterator iVar5;
  
  local_4f8 = fpath;
  std::fstream::fstream(&is,(string *)fpath,_S_out|_S_in);
  if ((abStack_220[(long)_is[-3]] & 5) == 0) {
    memset(&catchAssertionHandler,0,0x148);
    jsoncons::basic_json_options<char>::basic_json_options
              ((basic_json_options<char> *)&catchAssertionHandler);
    jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::parse
              (&tests,(basic_istream<char,_std::char_traits<char>_> *)&is,
               (basic_json_decode_options<char> *)&catchAssertionHandler);
    jsoncons::basic_json_options<char>::~basic_json_options
              ((basic_json_options<char> *)&catchAssertionHandler);
    count = 0;
    aVar7 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                      (&tests);
    while (local_498 = aVar7.last_._M_current, this = aVar7.first_._M_current,
          this._M_current != local_498._M_current) {
      count = count + 1;
      catchAssertionHandler.m_assertionInfo.macroName.m_start = &DAT_00000006;
      catchAssertionHandler.m_assertionInfo.macroName.m_size =
           (long)"Instance must not be valid against schema" + 0x23;
      local_4e8 = this._M_current;
      pbVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                         (this._M_current,(string_view_type *)&catchAssertionHandler);
      jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
                (&local_448,pbVar3);
      jsoncons::jsonschema::evaluation_options::evaluation_options(&local_290,options);
      jsoncons::jsonschema::
      make_json_schema<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>
                ((jsonschema *)&local_4f0,&local_448,resolver,&local_290);
      jsoncons::jsonschema::evaluation_options::~evaluation_options(&local_290);
      jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                (&local_448);
      count_test = 0;
      catchAssertionHandler.m_assertionInfo.macroName.m_start = &DAT_00000005;
      catchAssertionHandler.m_assertionInfo.macroName.m_size =
           (long)"json get_allocator() tests" + 0x15;
      pbVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
               operator[](local_4e8,(string_view_type *)&catchAssertionHandler);
      cVar8 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
              array_range(pbVar3);
      iVar5 = cVar8.last_._M_current;
      while( true ) {
        this_00 = cVar8.first_._M_current;
        if (this_00._M_current == iVar5._M_current) break;
        count_test = count_test + 1;
        errors = 0;
        local_458._M_len = 4;
        local_458._M_str = "data";
        pbVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                           (this_00._M_current,&local_458);
        instance_location.tokens_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        instance_location.tokens_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        instance_location.tokens_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                  (&patch,(evaluation_results *)&catchAssertionHandler);
        catchAssertionHandler.m_assertionInfo.lineInfo.file = (char *)0x0;
        catchAssertionHandler.m_assertionInfo.lineInfo.line = 0;
        catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x0;
        catchAssertionHandler.m_assertionInfo.macroName.m_size = 0;
        catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)operator_new(0x28);
        *(size_t **)catchAssertionHandler.m_assertionInfo.macroName.m_start = &errors;
        *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
         ((long)catchAssertionHandler.m_assertionInfo.macroName.m_start + 8) = this_00._M_current;
        *(string **)((long)catchAssertionHandler.m_assertionInfo.macroName.m_start + 0x10) =
             local_4f8;
        *(int **)((long)catchAssertionHandler.m_assertionInfo.macroName.m_start + 0x18) = &count;
        *(int **)((long)catchAssertionHandler.m_assertionInfo.macroName.m_start + 0x20) =
             &count_test;
        catchAssertionHandler.m_assertionInfo.lineInfo.line =
             (size_t)std::
                     _Function_handler<jsoncons::jsonschema::walk_result_(const_jsoncons::jsonschema::validation_message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonschema/src/jsonschema_draft202012_tests.cpp:64:37)>
                     ::_M_invoke;
        catchAssertionHandler.m_assertionInfo.lineInfo.file =
             (char *)std::
                     _Function_handler<jsoncons::jsonschema::walk_result_(const_jsoncons::jsonschema::validation_message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonschema/src/jsonschema_draft202012_tests.cpp:64:37)>
                     ::_M_manager;
        jsoncons::jsonschema::error_reporter_adaptor::error_reporter_adaptor
                  (&adaptor,(error_reporter_t *)&catchAssertionHandler);
        std::_Function_base::~_Function_base((_Function_base *)&catchAssertionHandler);
        context.eval_path_.tokens_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        context.eval_path_.tokens_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        context.dynamic_scope_.
        super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        context.eval_path_.tokens_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        context.dynamic_scope_.
        super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        context.dynamic_scope_.
        super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        context.flags_ = 0;
        catchAssertionHandler.m_assertionInfo.macroName.m_start =
             (char *)&catchAssertionHandler.m_assertionInfo.resultDisposition;
        catchAssertionHandler.m_assertionInfo.macroName.m_size = 1;
        catchAssertionHandler.m_assertionInfo.lineInfo.file = (char *)0x0;
        catchAssertionHandler.m_assertionInfo.lineInfo.line = 0;
        catchAssertionHandler.m_assertionInfo.capturedExpression.m_start._0_4_ = 0x3f800000;
        catchAssertionHandler.m_reaction.shouldDebugBreak = false;
        catchAssertionHandler.m_reaction.shouldThrow = false;
        catchAssertionHandler.m_completed = false;
        catchAssertionHandler._59_5_ = 0;
        catchAssertionHandler.m_resultCapture = (IResultCapture *)0x0;
        catchAssertionHandler.m_assertionInfo.capturedExpression.m_size = 0;
        catchAssertionHandler.m_assertionInfo.resultDisposition = 0;
        catchAssertionHandler.m_assertionInfo._52_4_ = 0;
        (**(code **)(*local_4f0 + 0x28))
                  (local_4f0,&context,pbVar3,&instance_location.tokens_,
                   (evaluation_results *)&catchAssertionHandler,&adaptor,&patch);
        jsoncons::jsonschema::evaluation_results::~evaluation_results
                  ((evaluation_results *)&catchAssertionHandler);
        jsoncons::jsonschema::
        eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
        ~eval_context(&context);
        jsoncons::jsonschema::error_reporter_adaptor::~error_reporter_adaptor(&adaptor);
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                  (&patch);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&instance_location.tokens_);
        iVar6._M_current = extraout_RDX;
        if (errors == 0) {
          context.dynamic_scope_.
          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_880c;
          context.dynamic_scope_.
          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_00000005;
          adaptor.super_error_reporter._vptr_error_reporter = (_func_int **)anon_var_dwarf_3128544;
          adaptor.super_error_reporter.error_count_ = 0x53;
          Catch::StringRef::StringRef(&local_468,"test_case[\"valid\"].as<bool>()");
          Catch::AssertionHandler::AssertionHandler
                    (&catchAssertionHandler,(StringRef *)&context,(SourceLineInfo *)&adaptor,
                     local_468,ContinueOnFailure);
          context.dynamic_scope_.
          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000005;
          context.dynamic_scope_.
          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6522f7;
          pbVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                   operator[](this_00._M_current,(string_view_type *)&context);
          bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                  as_bool(pbVar3);
          adaptor.super_error_reporter._vptr_error_reporter =
               (_func_int **)CONCAT71(adaptor.super_error_reporter._vptr_error_reporter._1_7_,bVar1)
          ;
          Catch::AssertionHandler::handleExpr<bool>
                    (&catchAssertionHandler,(ExprLhs<bool> *)&adaptor);
          Catch::AssertionHandler::complete(&catchAssertionHandler);
          Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
          catchAssertionHandler.m_assertionInfo.macroName.m_start = &DAT_00000005;
          catchAssertionHandler.m_assertionInfo.macroName.m_size =
               (long)"basic_string::_M_construct null not valid" + 0x24;
          pbVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                   operator[](this_00._M_current,(string_view_type *)&catchAssertionHandler);
          bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                  as_bool(pbVar3);
          iVar6._M_current = extraout_RDX_00;
          if (!bVar1) {
            poVar2 = std::operator<<((ostream *)&std::cout,"  File: ");
            poVar2 = std::operator<<(poVar2,(string *)local_4f8);
            std::operator<<(poVar2,"\n");
            poVar2 = std::operator<<((ostream *)&std::cout,"  Test case ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,count);
            poVar2 = std::operator<<(poVar2,".");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,count_test);
            poVar2 = std::operator<<(poVar2,": ");
            catchAssertionHandler.m_assertionInfo.macroName.m_start = &DAT_0000000b;
            catchAssertionHandler.m_assertionInfo.macroName.m_size =
                 (size_type)anon_var_dwarf_2a1fb24;
            pbVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                     operator[](this_00._M_current,(string_view_type *)&catchAssertionHandler);
            pbVar4 = jsoncons::operator<<
                               ((basic_ostream<char,_std::char_traits<char>_> *)poVar2,pbVar3);
            std::operator<<((ostream *)pbVar4,"\n");
            iVar6._M_current = extraout_RDX_01;
          }
        }
        cVar8.last_._M_current = iVar6._M_current;
        cVar8.first_._M_current = this_00._M_current + 1;
      }
      if (local_4f0 != (long *)0x0) {
        (**(code **)(*local_4f0 + 8))();
      }
      aVar7.last_._M_current = local_498._M_current;
      aVar7.first_._M_current = local_4e8 + 1;
    }
    jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&tests);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Cannot open file: ");
    poVar2 = std::operator<<(poVar2,(string *)local_4f8);
    std::operator<<(poVar2,"\n");
  }
  std::fstream::~fstream(&is);
  return;
}

Assistant:

void jsonschema_tests(const std::string& fpath,
        jsonschema::evaluation_options options = jsonschema::evaluation_options{}.default_version(jsonschema::schema_version::draft201909()))
    {
        std::fstream is(fpath);
        if (!is)
        {
            std::cout << "Cannot open file: " << fpath << "\n";
            return;
        }

        json tests = json::parse(is); 
        //std::cout << pretty_print(tests) << "\n";

        int count = 0;
        for (const auto& test_group : tests.array_range()) 
        {
            ++count;
            try
            {
                jsonschema::json_schema<json> compiled = jsonschema::make_json_schema(test_group.at("schema"), resolver, 
                    options);

                int count_test = 0;
                for (const auto& test_case : test_group["tests"].array_range()) 
                {
                    //std::cout << "  Test case " << count << "." << count_test << ": " << test_case["description"] << "\n";
                    ++count_test;
                    std::size_t errors = 0;
                    auto reporter = [&](const jsonschema::validation_message& msg) -> jsonschema::walk_result
                    {
                        ++errors;
                        CHECK_FALSE(test_case["valid"].as<bool>());
                        if (test_case["valid"].as<bool>())
                        {
                            std::cout << "  File: " << fpath << "\n";
                            std::cout << "  Test case " << count << "." << count_test << ": " << test_case["description"] << "\n";
                            std::cout << "  Failed: " << msg.instance_location().string() << ": " << msg.message() << "\n";
                            for (const auto& err : msg.details())
                            {
                                std::cout << "  Nested error: " << err.instance_location().string() << ": " << err.message() << "\n";
                            }
                        }
                        return jsonschema::walk_result::advance;
                    };
                    compiled.validate(test_case.at("data"), reporter);
                    if (errors == 0)
                    {
                        CHECK(test_case["valid"].as<bool>());
                        if (!test_case["valid"].as<bool>())
                        {
                            std::cout << "  File: " << fpath << "\n";
                            std::cout << "  Test case " << count << "." << count_test << ": " << test_case["description"] << "\n";
                        }
                    }
                }
            }
            catch (const std::exception& e)
            {
                std::cout << "  File: " << fpath << " " << count << "\n";
                std::cout << e.what() << "\n\n";
                CHECK(false);
            }
        }
    }